

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall soplex::SPxMainSM<double>::SPxMainSM(SPxMainSM<double> *this,TYPE ttype)

{
  ulong *puVar1;
  undefined8 *in_RDI;
  Real in_stack_ffffffffffffff70;
  undefined8 *p_fac;
  undefined8 in_stack_ffffffffffffff78;
  int n;
  undefined8 *puVar2;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_ffffffffffffff80;
  DataArray<int> *this_00;
  undefined8 in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  SPxSimplifier<double> *in_stack_ffffffffffffffa0;
  
  SPxSimplifier<double>::SPxSimplifier
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (TYPE)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  *in_RDI = &PTR__SPxMainSM_004ec7c8;
  VectorBase<double>::VectorBase((VectorBase<double> *)0x232407);
  VectorBase<double>::VectorBase((VectorBase<double> *)0x23241c);
  VectorBase<double>::VectorBase((VectorBase<double> *)0x232434);
  VectorBase<double>::VectorBase((VectorBase<double> *)0x23244c);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (int)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
             (int)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
  n = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::Array
            ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)
             in_stack_ffffffffffffff80,n);
  Array<soplex::DSVectorBase<double>_>::Array
            ((Array<soplex::DSVectorBase<double>_> *)in_stack_ffffffffffffff80,n);
  this_00 = (DataArray<int> *)(in_RDI + 0x2a);
  Array<soplex::DSVectorBase<double>_>::Array((Array<soplex::DSVectorBase<double>_> *)this_00,n);
  puVar2 = in_RDI + 0x2d;
  Array<soplex::DSVectorBase<double>_>::Array
            ((Array<soplex::DSVectorBase<double>_> *)this_00,(int)((ulong)puVar2 >> 0x20));
  p_fac = in_RDI + 0x30;
  Array<soplex::DSVectorBase<double>_>::Array
            ((Array<soplex::DSVectorBase<double>_> *)this_00,(int)((ulong)puVar2 >> 0x20));
  *(undefined1 *)(in_RDI + 0x33) = 0;
  DataArray<int>::DataArray(this_00,(int)((ulong)puVar2 >> 0x20),(int)puVar2,(Real)p_fac);
  *(undefined4 *)(in_RDI + 0x37) = 1;
  *(undefined1 *)((long)in_RDI + 0x1bc) = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)((long)in_RDI + 0x1c4) = 0;
  puVar1 = (ulong *)infinity();
  in_RDI[0x39] = *puVar1 ^ 0x8000000000000000;
  puVar1 = (ulong *)infinity();
  in_RDI[0x3a] = *puVar1 ^ 0x8000000000000000;
  return;
}

Assistant:

SPxMainSM(Timer::TYPE ttype = Timer::USER_TIME)
      : SPxSimplifier<R>("MainSM", ttype)
      , m_postsolved(0)
      , m_stat(16)
      , m_thesense(SPxLPBase<R>::MAXIMIZE)
      , m_keepbounds(false)
      , m_addedcols(0)
      , m_result(this->OKAY)
      , m_cutoffbound(R(-infinity))
      , m_pseudoobj(R(-infinity))
   {}